

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O0

void __thiscall UniValue::pushKV(UniValue *this,string *key,UniValue *val)

{
  bool bVar1;
  UniValue *in_RDX;
  UniValue *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  size_t idx;
  UniValue *in_stack_ffffffffffffff18;
  UniValue *in_stack_ffffffffffffff20;
  UniValue *pUVar2;
  UniValue *in_stack_ffffffffffffff28;
  UniValue local_80;
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  checkType(in_RSI,&in_RDX->typ);
  bVar1 = findKey(in_RSI,in_RDI,(size_t *)in_RDX);
  if (bVar1) {
    std::vector<UniValue,_std::allocator<UniValue>_>::operator[]
              ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffff28,
               (size_type)in_stack_ffffffffffffff20);
    operator=(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  }
  else {
    pUVar2 = (UniValue *)&stack0xffffffffffffffd8;
    std::__cxx11::string::string
              (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDX);
    UniValue(&local_80,pUVar2);
    pushKVEnd(in_RSI,in_RDI,in_RDX);
    ~UniValue(in_stack_ffffffffffffff18);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UniValue::pushKV(std::string key, UniValue val)
{
    checkType(VOBJ);

    size_t idx;
    if (findKey(key, idx))
        values[idx] = std::move(val);
    else
        pushKVEnd(std::move(key), std::move(val));
}